

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTWave_SetMatrixCoefficients
                   (FACTWave *pWave,uint32_t uSrcChannelCount,uint32_t uDstChannelCount,
                   float *pMatrixCoefficients)

{
  float fVar1;
  FAudioMutex pvVar2;
  FAudioVoice *voice;
  FAudioVoice *pDestinationVoice;
  long lVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  undefined8 uStack_40;
  float afStack_38 [2];
  
  pfVar5 = afStack_38;
  if (pWave == (FACTWave *)0x0) {
    return 1;
  }
  pfVar6 = pMatrixCoefficients;
  if (uSrcChannelCount == 2) {
    if (pWave->srcChannels == 1) {
      lVar4 = -((ulong)uDstChannelCount * 4 + 0xf & 0xfffffffffffffff0);
      pfVar5 = (float *)((long)afStack_38 + lVar4);
      *(undefined8 *)((long)afStack_38 + lVar4 + -8) = 1;
      uSrcChannelCount = (uint32_t)*(undefined8 *)((long)afStack_38 + lVar4 + -8);
      for (lVar4 = 0; pfVar6 = pfVar5, uDstChannelCount != (uint32_t)lVar4; lVar4 = lVar4 + 1) {
        pfVar5[lVar4] = (pMatrixCoefficients[lVar4 * 2] + pMatrixCoefficients[lVar4 * 2 + 1]) * 0.5;
      }
      goto LAB_0010c926;
    }
    uStack_40 = 2;
  }
  else {
    if (uSrcChannelCount != 1) goto LAB_0010c926;
    if (pWave->srcChannels == 2) {
      lVar4 = -((ulong)uDstChannelCount * 8 + 0xf & 0xfffffffffffffff0);
      pfVar5 = (float *)((long)afStack_38 + lVar4);
      *(undefined8 *)((long)afStack_38 + lVar4 + -8) = 2;
      uSrcChannelCount = (uint32_t)*(undefined8 *)((long)afStack_38 + lVar4 + -8);
      for (lVar3 = 0; pfVar6 = pfVar5, uDstChannelCount != (uint32_t)lVar3; lVar3 = lVar3 + 1) {
        fVar1 = pMatrixCoefficients[lVar3];
        pfVar5[lVar3 * 2] = fVar1;
        *(float *)((long)afStack_38 + lVar3 * 8 + lVar4 + 4) = fVar1;
      }
      goto LAB_0010c926;
    }
    uStack_40 = 1;
  }
  uSrcChannelCount = (uint32_t)uStack_40;
  pfVar5 = afStack_38;
LAB_0010c926:
  pvVar2 = pWave->parentBank->parentEngine->apiLock;
  pfVar5[-2] = 1.541552e-39;
  pfVar5[-1] = 0.0;
  FAudio_PlatformLockMutex(pvVar2);
  voice = pWave->voice;
  pDestinationVoice = ((voice->sends).pSends)->pOutputVoice;
  pfVar5[-2] = 1.541596e-39;
  pfVar5[-1] = 0.0;
  FAudioVoice_SetOutputMatrix(voice,pDestinationVoice,uSrcChannelCount,uDstChannelCount,pfVar6,0);
  pvVar2 = pWave->parentBank->parentEngine->apiLock;
  pfVar5[-2] = 1.541622e-39;
  pfVar5[-1] = 0.0;
  FAudio_PlatformUnlockMutex(pvVar2);
  return 0;
}

Assistant:

uint32_t FACTWave_SetMatrixCoefficients(
	FACTWave *pWave,
	uint32_t uSrcChannelCount,
	uint32_t uDstChannelCount,
	float *pMatrixCoefficients
) {
	uint32_t i;
	float *mtxDst, *mtxSrc, *mtxTmp = NULL;
	if (pWave == NULL)
	{
		return 1;
	}

	/* There seems to be this weird feature in XACT where the channel count
	 * can be completely wrong and it'll go to the right place.
	 * I guess these XACT functions do some extra work to merge coefficients
	 * but I have no idea where it really happens and XAudio2 definitely
	 * does NOT like it when this is wrong, so here it goes...
	 * -flibit
	 */
	if (uSrcChannelCount == 1 && pWave->srcChannels == 2)
	{
		mtxTmp = (float*) FAudio_alloca(
			sizeof(float) *
			pWave->srcChannels *
			uDstChannelCount
		);
		mtxDst = mtxTmp;
		mtxSrc = pMatrixCoefficients;
		for (i = 0; i < uDstChannelCount; i += 1)
		{
			mtxDst[0] = *mtxSrc;
			mtxDst[1] = *mtxSrc;
			mtxDst += 2;
			mtxSrc += 1;
		}
		uSrcChannelCount = 2;
		pMatrixCoefficients = mtxTmp;
	}
	else if (uSrcChannelCount == 2 && pWave->srcChannels == 1)
	{
		mtxTmp = (float*) FAudio_alloca(
			sizeof(float) *
			pWave->srcChannels *
			uDstChannelCount
		);
		mtxDst = mtxTmp;
		mtxSrc = pMatrixCoefficients;
		for (i = 0; i < uDstChannelCount; i += 1)
		{
			*mtxDst = (mtxSrc[0] + mtxSrc[1]) / 2.0f;
			mtxDst += 1;
			mtxSrc += 2;
		}
		uSrcChannelCount = 1;
		pMatrixCoefficients = mtxTmp;
	}

	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);

	FAudioVoice_SetOutputMatrix(
		pWave->voice,
		pWave->voice->sends.pSends->pOutputVoice,
		uSrcChannelCount,
		uDstChannelCount,
		pMatrixCoefficients,
		0
	);

	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	if (mtxTmp != NULL)
	{
		FAudio_dealloca(mtxTmp);
	}
	return 0;
}